

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O2

void __thiscall
luna::Library::RegisterToTable(Library *this,Table *table,TableMemberReg *table_reg,size_t size)

{
  ValueT VVar1;
  bool bVar2;
  
  while (bVar2 = size != 0, size = size - 1, bVar2) {
    VVar1 = table_reg->type_;
    if (VVar1 == ValueT_Number) {
      RegisterNumber(this,table,table_reg->name_,(table_reg->field_1).number_);
    }
    else if (VVar1 == ValueT_String) {
      RegisterString(this,table,table_reg->name_,(table_reg->field_1).str_);
    }
    else if (VVar1 == ValueT_CFunction) {
      RegisterFunc(this,table,table_reg->name_,(table_reg->field_1).func_);
    }
    table_reg = table_reg + 1;
  }
  return;
}

Assistant:

void Library::RegisterToTable(Table *table, const TableMemberReg *table_reg,
                                  std::size_t size)
    {
        for (std::size_t i = 0; i < size; ++i)
        {
            switch (table_reg[i].type_)
            {
                case ValueT_CFunction:
                    RegisterFunc(table, table_reg[i].name_, table_reg[i].func_);
                    break;
                case ValueT_Number:
                    RegisterNumber(table, table_reg[i].name_, table_reg[i].number_);
                    break;
                case ValueT_String:
                    RegisterString(table, table_reg[i].name_, table_reg[i].str_);
                    break;
                default: break;
            }
        }
    }